

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EnumStatement(SQCompiler *this)

{
  SQObjectValue this_00;
  undefined8 this_01;
  SQObject SVar1;
  SQObjectPtr local_e0;
  SQObjectPtr local_d0;
  undefined1 local_c0 [8];
  SQObjectPtr strongid;
  SQTable *enums;
  SQObjectPtr local_98;
  SQObjectPtr local_88;
  SQObjectType local_78;
  undefined4 uStack_74;
  SQObjectValue local_70;
  undefined1 local_68 [8];
  SQObject val;
  SQObject key;
  SQInteger nval;
  SQObject table;
  undefined1 local_20 [8];
  SQObject id;
  SQCompiler *this_local;
  
  id._unVal = (SQObjectValue)this;
  Lex(this);
  SVar1 = Expect(this,0x102);
  id._0_8_ = SVar1._unVal;
  local_20._0_4_ = SVar1._type;
  SVar1 = Expect(this,0x7b);
  table._unVal.fFloat = (SQFloat)SVar1._type;
  SVar1 = SQFuncState::CreateTable(this->_fs);
  table._0_8_ = SVar1._unVal;
  nval._0_4_ = SVar1._type;
  key._unVal.pTable = (SQTable *)0x0;
  while (this->_token != 0x7d) {
    SVar1 = Expect(this,0x102);
    val._unVal.fFloat = (SQFloat)SVar1._type;
    if (this->_token == 0x3d) {
      Lex(this);
      SVar1 = ExpectScalar(this);
      local_70 = SVar1._unVal;
      local_78 = SVar1._type;
      local_68._4_4_ = uStack_74;
      local_68._0_4_ = local_78;
      val._0_8_ = local_70.nInteger;
    }
    else {
      local_68._0_4_ = OT_INTEGER;
      val._0_8_ = key._unVal;
      key._unVal.pTable = (SQTable *)(key._unVal.nInteger + 1);
    }
    this_01 = table._0_8_;
    ::SQObjectPtr::SQObjectPtr(&local_88,(SQObject *)&val._unVal);
    ::SQObjectPtr::SQObjectPtr(&local_98,(SQObject *)local_68);
    SQTable::NewSlot((SQTable *)this_01,&local_88,&local_98);
    ::SQObjectPtr::~SQObjectPtr(&local_98);
    ::SQObjectPtr::~SQObjectPtr(&local_88);
    if (this->_token == 0x2c) {
      Lex(this);
    }
  }
  strongid.super_SQObject._unVal = (this->_vm->_sharedstate->_consts).super_SQObject._unVal;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_c0,(SQObject *)local_20);
  this_00 = strongid.super_SQObject._unVal;
  ::SQObjectPtr::SQObjectPtr(&local_d0,(SQObjectPtr *)local_c0);
  ::SQObjectPtr::SQObjectPtr(&local_e0,(SQObject *)&nval);
  SQTable::NewSlot(this_00.pTable,&local_d0,&local_e0);
  ::SQObjectPtr::~SQObjectPtr(&local_e0);
  ::SQObjectPtr::~SQObjectPtr(&local_d0);
  ::SQObjectPtr::Null((SQObjectPtr *)local_c0);
  Lex(this);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_c0);
  return;
}

Assistant:

void EnumStatement()
    {
        Lex();
        SQObject id = Expect(TK_IDENTIFIER);
        Expect(_SC('{'));

        SQObject table = _fs->CreateTable();
        SQInteger nval = 0;
        while(_token != _SC('}')) {
            SQObject key = Expect(TK_IDENTIFIER);
            SQObject val;
            if(_token == _SC('=')) {
                Lex();
                val = ExpectScalar();
            }
            else {
                val._type = OT_INTEGER;
                val._unVal.nInteger = nval++;
            }
            _table(table)->NewSlot(SQObjectPtr(key),SQObjectPtr(val));
            if(_token == ',') Lex();
        }
        SQTable *enums = _table(_ss(_vm)->_consts);
        SQObjectPtr strongid = id;
        enums->NewSlot(SQObjectPtr(strongid),SQObjectPtr(table));
        strongid.Null();
        Lex();
    }